

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void CVmBifTADS::get_max(uint argc)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  vm_val_t cur_max;
  vm_val_t lst;
  vm_val_t ele;
  vm_val_t local_88;
  uint local_6c;
  vm_val_t local_68;
  vm_val_t local_58;
  vm_val_t local_40;
  
  if (argc == 0) {
    err_throw(0x899);
  }
  local_88.typ = sp_[-1].typ;
  local_88._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  local_88.val = sp_[-1].val;
  if (argc == 1) {
    iVar3 = vm_val_t::is_listlike(&local_88);
    if (iVar3 != 0) {
      local_58.typ = local_88.typ;
      local_58._4_4_ = local_88._4_4_;
      local_58.val = local_88.val;
      local_6c = argc;
      uVar4 = vm_val_t::ll_length(&local_58);
      if (uVar4 == 0) {
        err_throw(0x902);
      }
      local_68.typ = VM_INT;
      local_68.val.obj = 1;
      vm_val_t::ll_index(&local_58,&local_88,&local_68);
      argc = local_6c;
      if (uVar4 != 1) {
        uVar6 = 2;
        do {
          local_68.typ = VM_INT;
          local_68.val.obj = uVar6;
          vm_val_t::ll_index(&local_58,&local_40,&local_68);
          iVar3 = vm_val_t::compare_to(&local_40,&local_88);
          if (0 < iVar3) {
            local_88.typ = local_40.typ;
            local_88._4_4_ = local_40._4_4_;
            local_88.val = local_40.val;
          }
          uVar6 = uVar6 + 1;
          argc = local_6c;
        } while (uVar6 <= uVar4);
      }
    }
  }
  else {
    uVar7 = 2;
    if (2 < argc) {
      uVar7 = (ulong)argc;
    }
    lVar5 = -0x20;
    do {
      iVar3 = vm_val_t::compare_to((vm_val_t *)((long)&sp_->typ + lVar5),&local_88);
      if (0 < iVar3) {
        puVar1 = (undefined8 *)((long)&sp_->typ + lVar5);
        local_88._0_8_ = *puVar1;
        local_88.val = *(anon_union_8_8_cb74652f_for_val *)(puVar1 + 1);
      }
      lVar2 = uVar7 * 0x10 + lVar5;
      lVar5 = lVar5 + -0x10;
    } while (lVar2 != 0);
  }
  sp_ = sp_ + -(long)(int)argc;
  CVmBif::retval(&local_88);
  return;
}

Assistant:

void CVmBifTADS::get_max(VMG_ uint argc)
{
    uint i;
    vm_val_t cur_max;
    
    /* make sure we have at least one argument */
    if (argc < 1)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* start with the first argument as the presumptive maximum */
    cur_max = *G_stk->get(0);

    /* if there's one list-like argument, get the max of the list elements */
    if (argc == 1 && cur_max.is_listlike(vmg0_))
    {
        /* get the list length */
        vm_val_t lst = cur_max;
        uint cnt = lst.ll_length(vmg0_);

        /* if it's a zero-element list, it's an error */
        if (cnt == 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* get the first element as the tentative maximum */
        lst.ll_index(vmg_ &cur_max, 1);

        /* compare each additional list element */
        for (i = 2 ; i <= cnt ; ++i)
        {
            /* compare the current element and keep it if it's the highest */
            vm_val_t ele;
            lst.ll_index(vmg_ &ele, i);
            if (ele.compare_to(vmg_ &cur_max) > 0)
                cur_max = ele;
        }
    }
    else
    {
        /* compare each argument in turn */
        for (i = 1 ; i < argc ; ++i)
        {
            /* 
             *   compare this value to the maximum so far; if this value is
             *   greater, it becomes the new maximum so far 
             */
            if (G_stk->get(i)->compare_to(vmg_ &cur_max) > 0)
                cur_max = *G_stk->get(i);
        }
    }

    /* discard the arguments */
    G_stk->discard(argc);

    /* return the maximum value */
    retval(vmg_ &cur_max);
}